

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTruth.c
# Opt level: O2

void Gia_ObjComputeTruth6CisSupport_rec(Gia_Man_t *p,int iObj,Vec_Int_t *vSupp)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Gia_Obj_t *pObj;
  ulong uVar5;
  
  while( true ) {
    pObj = Gia_ManObj(p,iObj);
    iVar2 = Gia_ObjIsTravIdCurrentId(p,iObj);
    if (iVar2 != 0) {
      return;
    }
    Gia_ObjSetTravIdCurrentId(p,iObj);
    uVar3 = (uint)*(undefined8 *)pObj;
    if ((~uVar3 & 0x9fffffff) == 0) break;
    if (((int)uVar3 < 0) || ((uVar3 & 0x1fffffff) == 0x1fffffff)) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTruth.c"
                    ,0x16a,"void Gia_ObjComputeTruth6CisSupport_rec(Gia_Man_t *, int, Vec_Int_t *)")
      ;
    }
    iVar2 = Gia_ObjFaninId0p(p,pObj);
    Gia_ObjComputeTruth6CisSupport_rec(p,iVar2,vSupp);
    iObj = Gia_ObjFaninId1p(p,pObj);
  }
  uVar3 = vSupp->nSize;
  if (uVar3 == vSupp->nCap) {
    iVar2 = 0x10;
    if (0xf < (int)uVar3) {
      iVar2 = uVar3 * 2;
    }
    Vec_IntGrow(vSupp,iVar2);
    uVar3 = vSupp->nSize;
  }
  vSupp->nSize = uVar3 + 1;
  piVar1 = vSupp->pArray;
  for (uVar5 = (ulong)uVar3;
      (uVar4 = (int)uVar3 >> 0x1f & uVar3, 0 < (int)(uint)uVar5 &&
      (uVar4 = (uint)uVar5, iObj < piVar1[uVar5 - 1])); uVar5 = uVar5 - 1) {
    piVar1[uVar5] = piVar1[uVar5 - 1];
  }
  piVar1[(int)uVar4] = iObj;
  return;
}

Assistant:

void Gia_ObjComputeTruth6CisSupport_rec( Gia_Man_t * p, int iObj, Vec_Int_t * vSupp )
{
    Gia_Obj_t * pObj = Gia_ManObj( p, iObj );
    if ( Gia_ObjIsTravIdCurrentId(p, iObj) )
        return;
    Gia_ObjSetTravIdCurrentId(p, iObj);
    if ( Gia_ObjIsCi(pObj) )
    {
        Vec_IntPushOrder( vSupp, iObj );
        return;
    }
    assert( Gia_ObjIsAnd(pObj) );
    Gia_ObjComputeTruth6CisSupport_rec( p, Gia_ObjFaninId0p(p, pObj), vSupp );
    Gia_ObjComputeTruth6CisSupport_rec( p, Gia_ObjFaninId1p(p, pObj), vSupp );
}